

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.c
# Opt level: O0

unsigned_short readushort(FILE *f,int bigendian)

{
  size_t sVar1;
  byte local_1e;
  byte local_1d;
  int local_1c;
  uchar c2;
  uchar c1;
  FILE *pFStack_18;
  int bigendian_local;
  FILE *f_local;
  
  local_1c = bigendian;
  pFStack_18 = (FILE *)f;
  sVar1 = fread(&local_1d,1,1,(FILE *)f);
  if (sVar1 == 0) {
    fprintf(_stderr,"\nError: fread return a number of element different from the expected.\n");
    f_local._6_2_ = 0;
  }
  else {
    sVar1 = fread(&local_1e,1,1,pFStack_18);
    if (sVar1 == 0) {
      fprintf(_stderr,"\nError: fread return a number of element different from the expected.\n");
      f_local._6_2_ = 0;
    }
    else if (local_1c == 0) {
      f_local._6_2_ = (ushort)local_1e * 0x100 + (ushort)local_1d;
    }
    else {
      f_local._6_2_ = (ushort)local_1d * 0x100 + (ushort)local_1e;
    }
  }
  return f_local._6_2_;
}

Assistant:

static unsigned short readushort(FILE * f, int bigendian)
{
    unsigned char c1, c2;
    if (!fread(&c1, 1, 1, f)) {
        fprintf(stderr,
                "\nError: fread return a number of element different from the expected.\n");
        return 0;
    }
    if (!fread(&c2, 1, 1, f)) {
        fprintf(stderr,
                "\nError: fread return a number of element different from the expected.\n");
        return 0;
    }
    if (bigendian) {
        return (unsigned short)((c1 << 8) + c2);
    } else {
        return (unsigned short)((c2 << 8) + c1);
    }
}